

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

void __thiscall rapidxml::xml_document<char>::parse<0>(xml_document<char> *this,char *text)

{
  xml_node<char> *child;
  undefined8 *puVar1;
  char *text_local;
  
  text_local = text;
  if (text == (char *)0x0) {
    __assert_fail("text",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/rapidxml/rapidxml.hpp"
                  ,0x567,"void rapidxml::xml_document<>::parse(Ch *) [Ch = char, Flags = 0]");
  }
  xml_node<char>::remove_all_nodes(&this->super_xml_node<char>);
  xml_node<char>::remove_all_attributes(&this->super_xml_node<char>);
  parse_bom<0>(this,&text_local);
  while( true ) {
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(&text_local);
    if (*text_local != '<') break;
    text_local = text_local + 1;
    child = parse_node<0>(this,&text_local);
    if (child != (xml_node<char> *)0x0) {
      xml_node<char>::append_node(&this->super_xml_node<char>,child);
    }
  }
  if (*text_local == '\0') {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar1 = &PTR__exception_00176490;
  puVar1[1] = "expected <";
  puVar1[2] = text_local;
  __cxa_throw(puVar1,&parse_error::typeinfo,std::exception::~exception);
}

Assistant:

void parse(Ch *text)
        {
            assert(text);
            
            // Remove current contents
            this->remove_all_nodes();
            this->remove_all_attributes();
            
            // Parse BOM, if any
            parse_bom<Flags>(text);
            
            // Parse children
            while (1)
            {
                // Skip whitespace before node
                skip<whitespace_pred, Flags>(text);
                if (*text == 0)
                    break;

                // Parse and append new child
                if (*text == Ch('<'))
                {
                    ++text;     // Skip '<'
                    if (xml_node<Ch> *node = parse_node<Flags>(text))
                        this->append_node(node);
                }
                else
                    RAPIDXML_PARSE_ERROR("expected <", text);
            }

        }